

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

void tinygltf::SerializeGltfBuffer(Buffer *buffer,json *o)

{
  string *psVar1;
  tinygltf *this;
  string header;
  string encodedData;
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char local_78 [16];
  undefined1 local_68 [32];
  string *local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  psVar1 = (string *)(local_a8 + 0x10);
  local_a8._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"byteLength","");
  SerializeNumberProperty<unsigned_long>
            ((string *)local_a8._0_8_,
             (long)(buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,o);
  if ((string *)local_a8._0_8_ != psVar1) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_88._M_allocated_capacity = 0x25;
  local_a8._0_8_ = psVar1;
  local_a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_a8,(ulong)&local_88);
  local_a8._16_8_ = local_88._M_allocated_capacity;
  (((string *)local_a8._0_8_)->_M_dataplus)._M_p = (pointer)0x7070613a61746164;
  ((string *)local_a8._0_8_)->_M_string_length = 0x6e6f69746163696c;
  (((string *)local_a8._0_8_)->field_2)._M_allocated_capacity = 0x732d746574636f2f;
  builtin_strncpy((char *)((long)&((string *)local_a8._0_8_)->field_2 + 8),"tream;ba",8);
  *(undefined8 *)((long)&((string *)local_a8._0_8_)->field_2 + 0xd) = 0x2c3436657361623b;
  local_a8._8_8_ = local_88._M_allocated_capacity;
  *(char *)((long)&(((string *)local_a8._0_8_)->_M_dataplus)._M_p + local_88._M_allocated_capacity)
       = '\0';
  this = (tinygltf *)
         (buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  base64_encode_abi_cxx11_
            ((string *)&local_88,this,
             (uchar *)(ulong)(uint)(*(int *)&(buffer->data).
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish - (int)this)
             ,(uint)local_88._M_allocated_capacity);
  local_38 = 0x697275;
  local_40 = 3;
  local_48 = (string *)&local_38;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
  SerializeStringProperty(local_48,(string *)local_68._0_8_,o);
  if ((string *)local_68._0_8_ != (string *)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_);
  }
  if (local_48 != (string *)&local_38) {
    operator_delete(local_48);
  }
  if ((char *)local_88._M_allocated_capacity != local_78) {
    operator_delete((void *)local_88._M_allocated_capacity);
  }
  if ((string *)local_a8._0_8_ != psVar1) {
    operator_delete((void *)local_a8._0_8_);
  }
  if ((buffer->name)._M_string_length != 0) {
    local_a8._0_8_ = psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"name","");
    SerializeStringProperty((string *)local_a8._0_8_,(string *)(buffer->name)._M_dataplus._M_p,o);
    if ((string *)local_a8._0_8_ != psVar1) {
      operator_delete((void *)local_a8._0_8_);
    }
  }
  if ((char)(buffer->extras).type_ != '\0') {
    local_a8._0_8_ = psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"extras","");
    SerializeValue((string *)local_a8,&buffer->extras,o);
    if ((string *)local_a8._0_8_ != psVar1) {
      operator_delete((void *)local_a8._0_8_);
    }
  }
  return;
}

Assistant:

static void SerializeGltfBuffer(Buffer &buffer, json &o) {
  SerializeNumberProperty("byteLength", buffer.data.size(), o);
  SerializeGltfBufferData(buffer.data, o);

  if (buffer.name.size()) SerializeStringProperty("name", buffer.name, o);

  if (buffer.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", buffer.extras, o);
  }
}